

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O0

png_fixed_point
png_muldiv_warn(png_const_structrp png_ptr,png_fixed_point a,png_int_32 times,png_int_32 divisor)

{
  int iVar1;
  png_fixed_point local_28;
  png_int_32 local_24;
  png_fixed_point result;
  png_int_32 divisor_local;
  png_int_32 times_local;
  png_fixed_point a_local;
  png_const_structrp png_ptr_local;
  
  local_24 = divisor;
  result = times;
  divisor_local = a;
  _times_local = png_ptr;
  iVar1 = png_muldiv(&local_28,a,times,divisor);
  if (iVar1 == 0) {
    png_warning(_times_local,"fixed point overflow ignored");
    png_ptr_local._4_4_ = 0;
  }
  else {
    png_ptr_local._4_4_ = local_28;
  }
  return png_ptr_local._4_4_;
}

Assistant:

png_fixed_point
png_muldiv_warn(png_const_structrp png_ptr, png_fixed_point a, png_int_32 times,
    png_int_32 divisor)
{
   png_fixed_point result;

   if (png_muldiv(&result, a, times, divisor) != 0)
      return result;

   png_warning(png_ptr, "fixed point overflow ignored");
   return 0;
}